

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::FatalTask::~FatalTask(FatalTask *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~FatalTask((FatalTask *)0x99f148);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

FatalTask() : SeverityTask(KnownSystemName::Fatal, ElabSystemTaskKind::Fatal) {
        neverReturns = true;
    }